

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cond.cpp
# Opt level: O2

String * __thiscall
Hpipe::Cond::ko_cpp(String *__return_storage_ptr__,Cond *this,String *var,Cond *not_in)

{
  Cond tmp;
  String SStack_68;
  Cond local_48;
  
  std::bitset<256UL>::operator~(&local_48.p,&this->p);
  std::__cxx11::string::string((string *)&SStack_68,(string *)var);
  ok_cpp(__return_storage_ptr__,&local_48,&SStack_68,not_in);
  std::__cxx11::string::~string((string *)&SStack_68);
  return __return_storage_ptr__;
}

Assistant:

String Cond::ko_cpp( String var, const Cond *not_in ) const {
    Cond tmp = ~ *this;
    return tmp.ok_cpp( var, not_in );
}